

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::Generators::RandomFloatingGenerator<long_double>::RandomFloatingGenerator
          (RandomFloatingGenerator<long_double> *this,longdouble a,longdouble b,uint32_t seed)

{
  longdouble lVar1;
  PImpl *__return_storage_ptr__;
  uint32_t uVar2;
  undefined4 in_register_00000034;
  _Adaptor<Catch::SimplePcg32,_long_double> __aurng;
  longdouble in_ST0;
  
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase.m_stringReprCache._M_dataplus.
  _M_p = (pointer)&(this->super_IGenerator<long_double>).super_GeneratorUntypedBase.
                   m_stringReprCache.field_2;
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase.m_stringReprCache.
  _M_string_length = 0;
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase.m_stringReprCache.field_2.
  _M_local_buf[0] = '\0';
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase.m_currentElementIndex = 0;
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_001af398;
  uVar2 = seed;
  __return_storage_ptr__ = (PImpl *)operator_new(0x30);
  (__return_storage_ptr__->rng).m_state = (ulong)seed * 0x5851f42d4c957f2d + 0x6f1903917447ed96;
  (__return_storage_ptr__->dist)._M_param._M_a = a;
  (__return_storage_ptr__->dist)._M_param._M_b = b;
  (this->m_pimpl).m_ptr = __return_storage_ptr__;
  std::generate_canonical<long_double,64ul,Catch::SimplePcg32>
            ((longdouble *)__return_storage_ptr__,
             (SimplePcg32 *)CONCAT44(in_register_00000034,uVar2));
  lVar1 = (__return_storage_ptr__->dist)._M_param._M_a;
  this->m_current_number = in_ST0 * ((__return_storage_ptr__->dist)._M_param._M_b - lVar1) + lVar1;
  return;
}

Assistant:

RandomFloatingGenerator<long double>::RandomFloatingGenerator(
            long double a, long double b, std::uint32_t seed) :
            m_pimpl(Catch::Detail::make_unique<PImpl>(a, b, seed)) {
            static_cast<void>( next() );
        }